

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall xmrig::OclBackendPrivate::start(OclBackendPrivate *this,Job *job)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer pOVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  PciTopology *pPVar10;
  long local_a0;
  String local_70;
  String local_60;
  string local_50;
  
  Log::print("\x1b[1;37m|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME\x1b[0m");
  pOVar7 = (this->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_a0 = 0;
  for (pPVar10 = &(((this->threads).
                    super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
                    _M_impl.super__Vector_impl_data._M_start)->device).m_topology;
      (pointer)(pPVar10 + -0x1f) != pOVar7; pPVar10 = pPVar10 + 0x38) {
    uVar1 = *(uint *)(pPVar10 + 0x12);
    PciTopology::toString((PciTopology *)&local_60);
    pcVar8 = local_60.m_data;
    uVar2 = *(uint *)(pPVar10 + 0x13);
    uVar3 = *(uint *)(pPVar10 + 0x15);
    uVar4 = *(uint *)(pPVar10 + 0x17);
    _Var9._M_p = "-";
    uVar5 = uVar2;
    if (uVar3 == 2) {
      std::__cxx11::to_string(&local_50,*(uint *)(pPVar10 + 0x14));
      uVar5 = *(uint *)(pPVar10 + 0x13);
      _Var9._M_p = local_50._M_dataplus._M_p;
    }
    uVar6 = *(uint *)(pPVar10 + 0x16);
    OclDevice::printableName((OclDevice *)&local_70);
    Log::print("|\x1b[1;36m%3zu\x1b[0m |\x1b[1;36m%4u\x1b[0m |\x1b[0;33m %7s\x1b[0m |\x1b[1;36m%5u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3s\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[0;36m%5zu\x1b[0m | %s"
               ,local_a0,(ulong)uVar1,pcVar8,(ulong)uVar2,(ulong)uVar4,(ulong)uVar3,_Var9._M_p,
               (ulong)uVar6,(ulong)uVar5,local_70.m_data);
    String::~String(&local_70);
    if (uVar3 == 2) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    String::~String(&local_60);
    local_a0 = local_a0 + 1;
  }
  OclSharedState::start(&this->threads,job);
  OclLaunchStatus::start
            (&this->status,
             ((long)(this->threads).
                    super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->threads).
                   super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xe0);
  Workers<xmrig::OclLaunchData>::start(&this->workers,&this->threads);
  return;
}

Assistant:

inline void start(const Job &job)
    {
        Log::print(WHITE_BOLD("|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME"));

        size_t i = 0;
        for (const auto &data : threads) {
            Log::print("|" CYAN_BOLD("%3zu") " |" CYAN_BOLD("%4u") " |" YELLOW(" %7s") " |" CYAN_BOLD("%5u") " |" CYAN_BOLD("%3u") " |"
                       CYAN_BOLD("%3u") " |" CYAN_BOLD("%3s") " |" CYAN_BOLD("%3u") " |" CYAN("%5zu") " | %s",
                       i,
                       data.thread.index(),
                       data.device.topology().toString().data(),
                       data.thread.intensity(),
                       data.thread.worksize(),
                       data.thread.stridedIndex(),
                       data.thread.stridedIndex() == 2 ? std::to_string(data.thread.memChunk()).c_str() : "-",
                       data.thread.unrollFactor(),
                       data.thread.intensity(),
                       data.device.printableName().data()
                       );

                    i++;
        }

        OclSharedState::start(threads, job);

        status.start(threads.size());
        workers.start(threads);
    }